

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O3

void __thiscall
geemuboi::test::core::CpuTest::verify_inc_dec_reg8
          (CpuTest *this,uint8_t instruction,Registers *expected_regs)

{
  uint8_t *puVar1;
  bool bVar2;
  char *message;
  AssertionResult gtest_ar;
  Message local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  puVar1 = &(this->regs).f;
  *puVar1 = *puVar1 | 0x10;
  execute_instruction(this,instruction);
  expected_regs->pc = 1;
  expected_regs->f = expected_regs->f | 0x10;
  verify_state_changes(this,expected_regs);
  local_30.ss_.ptr_._0_4_ =
       (*((this->cpu)._M_t.
          super___uniq_ptr_impl<geemuboi::core::ICpu,_std::default_delete<geemuboi::core::ICpu>_>.
          _M_t.
          super__Tuple_impl<0UL,_geemuboi::core::ICpu_*,_std::default_delete<geemuboi::core::ICpu>_>
          .super__Head_base<0UL,_geemuboi::core::ICpu_*,_false>._M_head_impl)->_vptr_ICpu[1])();
  local_28.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_20,"cpu->get_cycles_executed()","1",(uint *)&local_30,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message(&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/test/core/test_cpu.cpp"
               ,0x45,message);
    testing::internal::AssertHelper::operator=(&local_28,&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (CONCAT44(local_30.ss_.ptr_._4_4_,(int)local_30.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_30.ss_.ptr_._4_4_,(int)local_30.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_.ptr_._4_4_,(int)local_30.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void verify_inc_dec_reg8(uint8_t instruction, ICpu::Registers& expected_regs) {
        regs.f |= ICpu::C_FLAG;

        execute_instruction(instruction);

        expected_regs.pc = 1;
        expected_regs.f |= ICpu::C_FLAG;
        verify_state_changes(expected_regs);

        EXPECT_EQ(cpu->get_cycles_executed(), 1);
    }